

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_15(QPDF *pdf,char *arg2)

{
  char *pcVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  size_type sVar5;
  const_reference pvVar6;
  ulong uVar7;
  reference pQVar8;
  reference pvVar9;
  _IO_FILE *p_Var10;
  QPDFWriter local_5d8 [8];
  QPDFWriter w;
  FILE *out;
  string local_5b8;
  QPDFObjectHandle local_598;
  allocator<char> local_581;
  string local_580;
  QPDFObjectHandle local_560;
  allocator<char> local_549;
  string local_548;
  QPDFObjectHandle local_528;
  allocator<char> local_511;
  string local_510;
  QPDFObjectHandle local_4f0;
  allocator<char> local_4d9;
  string local_4d8;
  QPDFObjectHandle local_4b8;
  allocator<char> local_4a1;
  string local_4a0;
  QPDFObjectHandle local_480;
  QPDFObjectHandle local_470;
  QPDFObjectHandle local_460;
  QPDFObjGen local_450;
  QPDFObjGen local_448;
  QPDFObjectHandle local_440;
  QPDFObjGen local_430;
  QPDFObjGen local_428;
  QPDFObjectHandle local_420;
  QPDFObjectHandle local_410;
  QPDFObjGen local_400;
  QPDFObjGen local_3f8;
  QPDFObjectHandle local_3f0;
  QPDFObjectHandle local_3e0;
  QPDFObjGen local_3d0;
  QPDFObjGen local_3c8;
  QPDFObjectHandle local_3c0;
  QPDFObjectHandle local_3b0;
  allocator<char> local_399;
  string local_398;
  QPDFObjectHandle local_378;
  QPDFObjectHandle local_368;
  QPDFObjectHandle local_358;
  QPDFObjectHandle local_348;
  allocator<char> local_331;
  string local_330 [32];
  undefined1 local_310 [8];
  QPDFObjectHandle page;
  QPDFObjectHandle *iter;
  iterator __end1;
  iterator __begin1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range1;
  undefined1 local_2d8 [7];
  bool first;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_pages;
  QPDFObjectHandle page_template;
  string local_2a8 [32];
  value_type local_288;
  allocator<char> local_271;
  string local_270 [32];
  value_type local_250;
  allocator<char> local_239;
  string local_238 [32];
  value_type local_218;
  allocator<char> local_201;
  string local_200 [32];
  value_type local_1e0;
  allocator<char> local_1c9;
  string local_1c8 [32];
  value_type local_1a8;
  allocator<char> local_191;
  string local_190 [32];
  value_type local_170;
  undefined1 local_160 [8];
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> contents;
  string local_140;
  QPDFObjectHandle local_120;
  allocator<char> local_109;
  string local_108;
  QPDFObjectHandle local_e8;
  allocator<char> local_d1;
  string local_d0;
  QPDFObjectHandle local_b0;
  QPDFObjectHandle local_a0;
  allocator<char> local_89;
  string local_88;
  QPDFObjectHandle local_68;
  __normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
  local_58;
  QPDFObjectHandle local_50 [2];
  QPDFObjectHandle local_30;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *local_20;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pages;
  char *arg2_local;
  QPDF *pdf_local;
  
  pages = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)arg2;
  arg2_local = (char *)pdf;
  local_20 = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)QPDF::getAllPages();
  sVar5 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size(local_20);
  if (sVar5 != 10) {
    __assert_fail("pages.size() == 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x29a,"void test_15(QPDF &, const char *)");
  }
  bVar2 = QPDF::everPushedInheritedAttributesToPages();
  pcVar1 = arg2_local;
  if (((bVar2 ^ 0xff) & 1) == 0) {
    __assert_fail("!pdf.everPushedInheritedAttributesToPages()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x29b,"void test_15(QPDF &, const char *)");
  }
  pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::back(local_20);
  QPDFObjectHandle::QPDFObjectHandle(&local_30,pvVar6);
  QPDF::removePage((QPDFObjectHandle *)pcVar1);
  QPDFObjectHandle::~QPDFObjectHandle(&local_30);
  uVar7 = QPDF::everPushedInheritedAttributesToPages();
  if ((uVar7 & 1) == 0) {
    __assert_fail("pdf.everPushedInheritedAttributesToPages()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x29d,"void test_15(QPDF &, const char *)");
  }
  sVar5 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size(local_20);
  pcVar1 = arg2_local;
  if (sVar5 != 9) {
    __assert_fail("pages.size() == 9",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x29e,"void test_15(QPDF &, const char *)");
  }
  local_58._M_current =
       (QPDFObjectHandle *)
       std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin(local_20);
  pQVar8 = __gnu_cxx::
           __normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
           ::operator*(&local_58);
  QPDFObjectHandle::QPDFObjectHandle(local_50,pQVar8);
  QPDF::removePage((QPDFObjectHandle *)pcVar1);
  QPDFObjectHandle::~QPDFObjectHandle(local_50);
  sVar5 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size(local_20);
  if (sVar5 != 8) {
    __assert_fail("pages.size() == 8",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x2a0,"void test_15(QPDF &, const char *)");
  }
  pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(local_20,4);
  QPDFObjectHandle::QPDFObjectHandle(&local_68,pvVar6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"Original page 5",&local_89);
  checkPageContents(&local_68,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  QPDFObjectHandle::~QPDFObjectHandle(&local_68);
  pcVar1 = arg2_local;
  pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(local_20,4);
  QPDFObjectHandle::QPDFObjectHandle(&local_a0,pvVar6);
  QPDF::removePage((QPDFObjectHandle *)pcVar1);
  QPDFObjectHandle::~QPDFObjectHandle(&local_a0);
  sVar5 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size(local_20);
  if (sVar5 != 7) {
    __assert_fail("pages.size() == 7",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x2a3,"void test_15(QPDF &, const char *)");
  }
  pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(local_20,4);
  QPDFObjectHandle::QPDFObjectHandle(&local_b0,pvVar6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"Original page 6",&local_d1);
  checkPageContents(&local_b0,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  QPDFObjectHandle::~QPDFObjectHandle(&local_b0);
  pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(local_20,0);
  QPDFObjectHandle::QPDFObjectHandle(&local_e8,pvVar6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"Original page 1",&local_109);
  checkPageContents(&local_e8,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  QPDFObjectHandle::~QPDFObjectHandle(&local_e8);
  pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(local_20,6);
  QPDFObjectHandle::QPDFObjectHandle(&local_120,pvVar6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"Original page 8",
             (allocator<char> *)
             ((long)&contents.
                     super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage + 7));
  checkPageContents(&local_120,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&contents.
                     super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage + 7));
  QPDFObjectHandle::~QPDFObjectHandle(&local_120);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_160);
  pcVar1 = arg2_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_190,"New page 1",&local_191);
  createPageContents((QPDF *)&local_170,(string *)pcVar1);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_160,&local_170);
  QPDFObjectHandle::~QPDFObjectHandle(&local_170);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  pcVar1 = arg2_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1c8,"New page 0",&local_1c9);
  createPageContents((QPDF *)&local_1a8,(string *)pcVar1);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_160,&local_1a8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_1a8);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  pcVar1 = arg2_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_200,"New page 5",&local_201);
  createPageContents((QPDF *)&local_1e0,(string *)pcVar1);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_160,&local_1e0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_1e0);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator(&local_201);
  pcVar1 = arg2_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_238,"New page 6",&local_239);
  createPageContents((QPDF *)&local_218,(string *)pcVar1);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_160,&local_218);
  QPDFObjectHandle::~QPDFObjectHandle(&local_218);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator(&local_239);
  pcVar1 = arg2_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_270,"New page 11",&local_271);
  createPageContents((QPDF *)&local_250,(string *)pcVar1);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_160,&local_250);
  QPDFObjectHandle::~QPDFObjectHandle(&local_250);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator(&local_271);
  pcVar1 = arg2_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2a8,"New page 12",
             (allocator<char> *)
             ((long)&page_template.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  createPageContents((QPDF *)&local_288,(string *)pcVar1);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_160,&local_288);
  QPDFObjectHandle::~QPDFObjectHandle(&local_288);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&page_template.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(local_20,0);
  QPDFObjectHandle::QPDFObjectHandle
            ((QPDFObjectHandle *)
             &new_pages.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,pvVar6);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_2d8);
  bVar4 = true;
  __end1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_160);
  iter = (QPDFObjectHandle *)
         std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end
                   ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_160);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                *)&iter);
    pcVar1 = arg2_local;
    if (!bVar3) break;
    page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             __gnu_cxx::
             __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
             ::operator*(&__end1);
    QPDFObjectHandle::shallowCopy();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_330,"/Contents",&local_331);
    QPDFObjectHandle::replaceKey((string *)local_310,(QPDFObjectHandle *)local_330);
    std::__cxx11::string::~string(local_330);
    std::allocator<char>::~allocator(&local_331);
    if (bVar4) {
      bVar4 = false;
    }
    else {
      QPDFObjectHandle::QPDFObjectHandle(&local_358,(QPDFObjectHandle *)local_310);
      QPDF::makeIndirectObject((QPDFObjectHandle *)&local_348);
      QPDFObjectHandle::operator=((QPDFObjectHandle *)local_310,&local_348);
      QPDFObjectHandle::~QPDFObjectHandle(&local_348);
      QPDFObjectHandle::~QPDFObjectHandle(&local_358);
    }
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_2d8,
               (value_type *)local_310);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_310);
    __gnu_cxx::
    __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
    ::operator++(&__end1);
  }
  pvVar9 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_2d8,0);
  QPDFObjectHandle::QPDFObjectHandle(&local_368,pvVar9);
  QPDF::addPage((QPDFObjectHandle *)pcVar1,SUB81(&local_368,0));
  QPDFObjectHandle::~QPDFObjectHandle(&local_368);
  pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(local_20,0);
  QPDFObjectHandle::QPDFObjectHandle(&local_378,pvVar6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"New page 1",&local_399);
  checkPageContents(&local_378,&local_398);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator(&local_399);
  QPDFObjectHandle::~QPDFObjectHandle(&local_378);
  pcVar1 = arg2_local;
  pvVar9 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_2d8,1);
  QPDFObjectHandle::QPDFObjectHandle(&local_3b0,pvVar9);
  pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(local_20,0);
  QPDFObjectHandle::QPDFObjectHandle(&local_3c0,pvVar6);
  QPDF::addPageAt((QPDFObjectHandle *)pcVar1,SUB81(&local_3b0,0),(QPDFObjectHandle *)0x1);
  QPDFObjectHandle::~QPDFObjectHandle(&local_3c0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_3b0);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(local_20,0);
  local_3c8 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_2d8,1);
  local_3d0 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  bVar4 = QPDFObjGen::operator==(&local_3c8,&local_3d0);
  pcVar1 = arg2_local;
  if (!bVar4) {
    __assert_fail("pages.at(0).getObjGen() == new_pages.at(1).getObjGen()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x2cc,"void test_15(QPDF &, const char *)");
  }
  pvVar9 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_2d8,2);
  QPDFObjectHandle::QPDFObjectHandle(&local_3e0,pvVar9);
  pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(local_20,5);
  QPDFObjectHandle::QPDFObjectHandle(&local_3f0,pvVar6);
  QPDF::addPageAt((QPDFObjectHandle *)pcVar1,SUB81(&local_3e0,0),(QPDFObjectHandle *)0x1);
  QPDFObjectHandle::~QPDFObjectHandle(&local_3f0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_3e0);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(local_20,5);
  local_3f8 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_2d8,2);
  local_400 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  bVar4 = QPDFObjGen::operator==(&local_3f8,&local_400);
  pcVar1 = arg2_local;
  if (!bVar4) {
    __assert_fail("pages.at(5).getObjGen() == new_pages.at(2).getObjGen()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x2ce,"void test_15(QPDF &, const char *)");
  }
  pvVar9 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_2d8,3);
  QPDFObjectHandle::QPDFObjectHandle(&local_410,pvVar9);
  pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(local_20,5);
  QPDFObjectHandle::QPDFObjectHandle(&local_420,pvVar6);
  QPDF::addPageAt((QPDFObjectHandle *)pcVar1,SUB81(&local_410,0),(QPDFObjectHandle *)0x0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_420);
  QPDFObjectHandle::~QPDFObjectHandle(&local_410);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(local_20,6);
  local_428 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_2d8,3);
  local_430 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  bVar4 = QPDFObjGen::operator==(&local_428,&local_430);
  if (!bVar4) {
    __assert_fail("pages.at(6).getObjGen() == new_pages.at(3).getObjGen()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x2d0,"void test_15(QPDF &, const char *)");
  }
  sVar5 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size(local_20);
  pcVar1 = arg2_local;
  if (sVar5 != 0xb) {
    __assert_fail("pages.size() == 11",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x2d1,"void test_15(QPDF &, const char *)");
  }
  pvVar9 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_2d8,4);
  QPDFObjectHandle::QPDFObjectHandle(&local_440,pvVar9);
  QPDF::addPage((QPDFObjectHandle *)pcVar1,SUB81(&local_440,0));
  QPDFObjectHandle::~QPDFObjectHandle(&local_440);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(local_20,0xb);
  local_448 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_2d8,4);
  local_450 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  bVar4 = QPDFObjGen::operator==(&local_448,&local_450);
  pcVar1 = arg2_local;
  if (!bVar4) {
    __assert_fail("pages.at(11).getObjGen() == new_pages.at(4).getObjGen()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x2d3,"void test_15(QPDF &, const char *)");
  }
  pvVar9 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_2d8,5);
  QPDFObjectHandle::QPDFObjectHandle(&local_460,pvVar9);
  pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::back(local_20);
  QPDFObjectHandle::QPDFObjectHandle(&local_470,pvVar6);
  QPDF::addPageAt((QPDFObjectHandle *)pcVar1,SUB81(&local_460,0),(QPDFObjectHandle *)0x0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_470);
  QPDFObjectHandle::~QPDFObjectHandle(&local_460);
  sVar5 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size(local_20);
  if (sVar5 == 0xd) {
    pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(local_20,0);
    QPDFObjectHandle::QPDFObjectHandle(&local_480,pvVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,"New page 0",&local_4a1)
    ;
    checkPageContents(&local_480,&local_4a0);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::allocator<char>::~allocator(&local_4a1);
    QPDFObjectHandle::~QPDFObjectHandle(&local_480);
    pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(local_20,1);
    QPDFObjectHandle::QPDFObjectHandle(&local_4b8,pvVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d8,"New page 1",&local_4d9)
    ;
    checkPageContents(&local_4b8,&local_4d8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::allocator<char>::~allocator(&local_4d9);
    QPDFObjectHandle::~QPDFObjectHandle(&local_4b8);
    pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(local_20,5);
    QPDFObjectHandle::QPDFObjectHandle(&local_4f0,pvVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_510,"New page 5",&local_511)
    ;
    checkPageContents(&local_4f0,&local_510);
    std::__cxx11::string::~string((string *)&local_510);
    std::allocator<char>::~allocator(&local_511);
    QPDFObjectHandle::~QPDFObjectHandle(&local_4f0);
    pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(local_20,6);
    QPDFObjectHandle::QPDFObjectHandle(&local_528,pvVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_548,"New page 6",&local_549)
    ;
    checkPageContents(&local_528,&local_548);
    std::__cxx11::string::~string((string *)&local_548);
    std::allocator<char>::~allocator(&local_549);
    QPDFObjectHandle::~QPDFObjectHandle(&local_528);
    pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(local_20,0xb);
    QPDFObjectHandle::QPDFObjectHandle(&local_560,pvVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_580,"New page 11",&local_581);
    checkPageContents(&local_560,&local_580);
    std::__cxx11::string::~string((string *)&local_580);
    std::allocator<char>::~allocator(&local_581);
    QPDFObjectHandle::~QPDFObjectHandle(&local_560);
    pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(local_20,0xc);
    QPDFObjectHandle::QPDFObjectHandle(&local_598,pvVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5b8,"New page 12",(allocator<char> *)((long)&out + 7));
    checkPageContents(&local_598,&local_5b8);
    std::__cxx11::string::~string((string *)&local_5b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&out + 7));
    QPDFObjectHandle::~QPDFObjectHandle(&local_598);
    p_Var10 = (_IO_FILE *)QUtil::safe_fopen("a.pdf","wb");
    QPDFWriter::QPDFWriter(local_5d8,(QPDF *)arg2_local,"FILE* a.pdf",p_Var10,true);
    QPDFWriter::setStaticID(SUB81(local_5d8,0));
    QPDFWriter::setStreamDataMode((qpdf_stream_data_e)local_5d8);
    QPDFWriter::write();
    QPDFWriter::~QPDFWriter(local_5d8);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_2d8);
    QPDFObjectHandle::~QPDFObjectHandle
              ((QPDFObjectHandle *)
               &new_pages.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_160);
    return;
  }
  __assert_fail("pages.size() == 13",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0x2d5,"void test_15(QPDF &, const char *)");
}

Assistant:

static void
test_15(QPDF& pdf, char const* arg2)
{
    std::vector<QPDFObjectHandle> const& pages = pdf.getAllPages();
    // Reference to original page numbers for this test case are
    // numbered from 0.

    // Remove pages from various places, checking to make sure
    // that our pages reference is getting updated.
    assert(pages.size() == 10);
    assert(!pdf.everPushedInheritedAttributesToPages());
    pdf.removePage(pages.back()); // original page 9
    assert(pdf.everPushedInheritedAttributesToPages());
    assert(pages.size() == 9);
    pdf.removePage(*pages.begin()); // original page 0
    assert(pages.size() == 8);
    checkPageContents(pages.at(4), "Original page 5");
    pdf.removePage(pages.at(4)); // original page 5
    assert(pages.size() == 7);
    checkPageContents(pages.at(4), "Original page 6");
    checkPageContents(pages.at(0), "Original page 1");
    checkPageContents(pages.at(6), "Original page 8");

    // Insert pages

    // Create some content streams.
    std::vector<QPDFObjectHandle> contents;
    contents.push_back(createPageContents(pdf, "New page 1"));
    contents.push_back(createPageContents(pdf, "New page 0"));
    contents.push_back(createPageContents(pdf, "New page 5"));
    contents.push_back(createPageContents(pdf, "New page 6"));
    contents.push_back(createPageContents(pdf, "New page 11"));
    contents.push_back(createPageContents(pdf, "New page 12"));

    // Create some page objects.  Start with an existing
    // dictionary and modify it.  Using the results of
    // getDictAsMap to create a new dictionary effectively creates
    // a shallow copy.
    QPDFObjectHandle page_template = pages.at(0);
    std::vector<QPDFObjectHandle> new_pages;
    bool first = true;
    for (auto const& iter: contents) {
        // We will retain indirect object references to other
        // indirect objects other than page content.
        QPDFObjectHandle page = page_template.shallowCopy();
        page.replaceKey("/Contents", iter);
        if (first) {
            // leave direct
            first = false;
        } else {
            page = pdf.makeIndirectObject(page);
        }
        new_pages.push_back(page);
    }

    // Now insert the pages
    pdf.addPage(new_pages.at(0), true);
    checkPageContents(pages.at(0), "New page 1");
    pdf.addPageAt(new_pages.at(1), true, pages.at(0));
    assert(pages.at(0).getObjGen() == new_pages.at(1).getObjGen());
    pdf.addPageAt(new_pages.at(2), true, pages.at(5));
    assert(pages.at(5).getObjGen() == new_pages.at(2).getObjGen());
    pdf.addPageAt(new_pages.at(3), false, pages.at(5));
    assert(pages.at(6).getObjGen() == new_pages.at(3).getObjGen());
    assert(pages.size() == 11);
    pdf.addPage(new_pages.at(4), false);
    assert(pages.at(11).getObjGen() == new_pages.at(4).getObjGen());
    pdf.addPageAt(new_pages.at(5), false, pages.back());
    assert(pages.size() == 13);
    checkPageContents(pages.at(0), "New page 0");
    checkPageContents(pages.at(1), "New page 1");
    checkPageContents(pages.at(5), "New page 5");
    checkPageContents(pages.at(6), "New page 6");
    checkPageContents(pages.at(11), "New page 11");
    checkPageContents(pages.at(12), "New page 12");

    // Exercise writing to FILE*
    FILE* out = QUtil::safe_fopen("a.pdf", "wb");
    QPDFWriter w(pdf, "FILE* a.pdf", out, true);
    w.setStaticID(true);
    w.setStreamDataMode(qpdf_s_preserve);
    w.write();
}